

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psread.c
# Opt level: O2

FT_Fast cf2_buf_readByte(CF2_Buffer buf)

{
  byte *pbVar1;
  int *piVar2;
  
  pbVar1 = buf->ptr;
  if (pbVar1 < buf->end) {
    buf->ptr = pbVar1 + 1;
    return (FT_Fast)*pbVar1;
  }
  piVar2 = buf->error;
  if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
    *piVar2 = 0x55;
    return 0;
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( CF2_Int )
  cf2_buf_readByte( CF2_Buffer  buf )
  {
    if ( buf->ptr < buf->end )
    {
#if CF2_IO_FAIL
      if ( randomError2() )
      {
        CF2_SET_ERROR( buf->error, Invalid_Stream_Operation );
        return 0;
      }

      return *(buf->ptr)++ + randomValue();
#else
      return *(buf->ptr)++;
#endif
    }
    else
    {
      CF2_SET_ERROR( buf->error, Invalid_Stream_Operation );
      return 0;
    }
  }